

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content_chunked(Stream *strm,ContentReceiverWithProgress *out)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  __ssize_t _Var5;
  FILE *__args_3;
  int extraout_var;
  undefined8 *puVar6;
  FILE *pFVar7;
  FILE *in_RCX;
  size_t *in_RDX;
  size_t *__n;
  ulong uVar8;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *__n_00;
  size_t *__n_01;
  uint64_t r;
  FILE *pFVar9;
  _IO_marker **__endptr;
  _Any_data *__lineptr;
  stream_line_reader line_reader;
  char *end_ptr;
  char buf [16];
  char buf_1 [4096];
  undefined1 local_10e8 [16];
  size_t local_10d8;
  size_t local_10d0;
  undefined1 local_10c8 [32];
  _Any_data local_10a8;
  code *local_1098;
  code *pcStack_1090;
  ContentReceiverWithProgress *local_1088;
  _IO_marker *local_1080;
  FILE *local_1078;
  undefined1 local_1070 [8];
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_1068;
  char local_1048 [16];
  _Any_data local_1038 [256];
  unsigned_long __args_1;
  
  local_10c8._0_8_ = local_10c8 + 0x10;
  local_10e8._8_8_ = local_1048;
  local_10d8 = 0x10;
  local_10d0 = 0;
  local_10c8._8_8_ = (char *)0x0;
  local_10c8[0x10] = '\0';
  local_10e8._0_8_ = strm;
  local_1088 = out;
  _Var5 = stream_line_reader::getline((stream_line_reader *)local_10e8,(char **)out,in_RDX,in_RCX);
  if ((char)_Var5 == '\0') {
LAB_001156fd:
    bVar2 = false;
  }
  else {
    while( true ) {
      pFVar9 = (FILE *)(local_10e8 + 8);
      pFVar7 = (FILE *)local_10c8;
      if ((char *)local_10c8._8_8_ == (char *)0x0) {
        pFVar7 = pFVar9;
      }
      __endptr = &local_1080;
      __args_3 = (FILE *)strtoul(*(char **)pFVar7,(char **)__endptr,0x10);
      pFVar7 = (FILE *)local_10c8;
      if ((char *)local_10c8._8_8_ == (char *)0x0) {
        pFVar7 = pFVar9;
      }
      if ((local_1080 == *(_IO_marker **)pFVar7) || (__args_3 == (FILE *)0xffffffffffffffff)) break;
      if (__args_3 == (FILE *)0x0) {
        _Var5 = stream_line_reader::getline
                          ((stream_line_reader *)local_10e8,(char **)__endptr,__n,pFVar7);
        if ((char)_Var5 == '\0') goto LAB_001156fd;
        pFVar7 = (FILE *)local_10c8;
        if ((char *)local_10c8._8_8_ == (char *)0x0) {
          pFVar7 = pFVar9;
        }
        pcVar1 = *(char **)pFVar7;
        if (((*pcVar1 != '\r') || (pcVar1[1] != '\n')) || (pcVar1[2] != '\0')) goto LAB_001156fd;
LAB_001156c5:
        bVar2 = true;
        goto LAB_001156ff;
      }
      local_1098 = (code *)0x0;
      pcStack_1090 = (code *)0x0;
      local_10a8._M_unused._M_object = (char *)0x0;
      local_10a8._8_8_ = (char *)0x0;
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                (&local_1068,local_1088);
      pFVar9 = (FILE *)0x0;
      do {
        uVar8 = (long)__args_3 - (long)pFVar9;
        if (0xfff < uVar8) {
          uVar8 = 0x1000;
        }
        __lineptr = local_1038;
        iVar4 = (*strm->_vptr_Stream[4])(strm,local_1038,uVar8);
        __args_1 = CONCAT44(extraout_var,iVar4);
        __n_00 = extraout_RDX;
        if ((__args_1 == 0 || extraout_var < 0) ||
           (pFVar7 = pFVar9, __lineptr = local_1038,
           bVar2 = std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::
                   operator()(&local_1068,local_1038[0]._M_pod_data,__args_1,(unsigned_long)pFVar9,
                              (unsigned_long)__args_3), __n_00 = extraout_RDX_00, !bVar2)) {
LAB_00115635:
          bVar2 = false;
          goto LAB_00115637;
        }
        pFVar9 = (FILE *)((long)&pFVar9->_flags + __args_1);
        if (local_1098 != (code *)0x0) {
          __lineptr = (_Any_data *)local_1070;
          local_1078 = __args_3;
          local_1070 = (undefined1  [8])pFVar9;
          cVar3 = (*pcStack_1090)(&local_10a8,__lineptr,&local_1078);
          __n_00 = extraout_RDX_01;
          if (cVar3 == '\0') goto LAB_00115635;
        }
      } while (pFVar9 < __args_3);
      bVar2 = true;
LAB_00115637:
      if (local_1068.super__Function_base._M_manager != (_Manager_type)0x0) {
        __lineptr = (_Any_data *)&local_1068;
        (*local_1068.super__Function_base._M_manager)(__lineptr,__lineptr,__destroy_functor);
        __n_00 = extraout_RDX_02;
      }
      if (local_1098 != (code *)0x0) {
        __lineptr = &local_10a8;
        (*local_1098)(__lineptr,__lineptr,3);
        __n_00 = extraout_RDX_03;
      }
      if ((!bVar2) ||
         (_Var5 = stream_line_reader::getline
                            ((stream_line_reader *)local_10e8,(char **)__lineptr,__n_00,pFVar7),
         (char)_Var5 == '\0')) break;
      puVar6 = (undefined8 *)local_10c8;
      if ((char *)local_10c8._8_8_ == (char *)0x0) {
        puVar6 = (undefined8 *)(local_10e8 + 8);
      }
      pcVar1 = (char *)*puVar6;
      if (((*pcVar1 != '\r') || (pcVar1[1] != '\n')) || (pcVar1[2] != '\0')) goto LAB_001156c5;
      _Var5 = stream_line_reader::getline
                        ((stream_line_reader *)local_10e8,(char **)__lineptr,__n_01,pFVar7);
      if ((char)_Var5 == '\0') break;
    }
    bVar2 = false;
  }
LAB_001156ff:
  if ((undefined1 *)local_10c8._0_8_ != local_10c8 + 0x10) {
    operator_delete((void *)local_10c8._0_8_,CONCAT71(local_10c8._17_7_,local_10c8[0x10]) + 1);
  }
  return bVar2;
}

Assistant:

inline bool read_content_chunked(Stream &strm,
										 ContentReceiverWithProgress out) {
			const auto bufsiz = 16;
			char buf[bufsiz];

			stream_line_reader line_reader(strm, buf, bufsiz);

			if (!line_reader.getline()) { return false; }

			unsigned long chunk_len;
			while (true) {
				char *end_ptr;

				chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

				if (end_ptr == line_reader.ptr()) { return false; }
				if (chunk_len == ULONG_MAX) { return false; }

				if (chunk_len == 0) { break; }

				if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
					return false;
				}

				if (!line_reader.getline()) { return false; }

				if (strcmp(line_reader.ptr(), "\r\n")) { break; }

				if (!line_reader.getline()) { return false; }
			}

			if (chunk_len == 0) {
				// Reader terminator after chunks
				if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
					return false;
			}

			return true;
		}